

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O1

int arkStep_NlsFPFunction_MassFixed(N_Vector zcor,N_Vector g,void *arkode_mem)

{
  int iVar1;
  int iVar2;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_20;
  ARKodeMem local_18;
  
  iVar1 = arkStep_AccessARKODEStepMem
                    (arkode_mem,"arkStep_NlsFPFunction_MassFixed",&local_18,&local_20);
  if (iVar1 == 0) {
    N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,local_20->zpred,zcor,local_18->ycur);
    iVar2 = (*local_20->nls_fi)(local_18->tcur,local_18->ycur,local_20->Fi[local_20->istage],
                                local_18->user_data);
    local_20->nfi = local_20->nfi + 1;
    iVar1 = -8;
    if ((-1 < iVar2) && (iVar1 = 9, iVar2 == 0)) {
      N_VLinearSum(local_20->gamma,0x3ff0000000000000,local_20->Fi[local_20->istage],local_20->sdata
                   ,g);
      iVar2 = (*local_20->msolve)(local_18,g,local_20->nlscoef);
      iVar1 = -8;
      if (-1 < iVar2) {
        iVar1 = (uint)(iVar2 != 0) + (uint)(iVar2 != 0) * 8;
      }
    }
  }
  return iVar1;
}

Assistant:

int arkStep_NlsFPFunction_MassFixed(N_Vector zcor, N_Vector g, void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute implicit RHS and save for later */
  retval = step_mem->nls_fi(ark_mem->tcur, ark_mem->ycur,
                            step_mem->Fi[step_mem->istage], ark_mem->user_data);
  step_mem->nfi++;
  if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
  if (retval > 0) { return (RHSFUNC_RECVR); }

  /* combine parts:  g = gamma*Fi(z) + sdata */
  N_VLinearSum(step_mem->gamma, step_mem->Fi[step_mem->istage], ONE,
               step_mem->sdata, g);

  /* perform mass matrix solve */
  retval = step_mem->msolve((void*)ark_mem, g, step_mem->nlscoef);
  if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
  if (retval > 0) { return (RHSFUNC_RECVR); }

  return (ARK_SUCCESS);
}